

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::CreateParticleUpperBound(BaseTag *this)

{
  string *in_RSI;
  
  CreateParticleUpperBound
            ((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

ParticleUpperBound* BaseTag::CreateParticleUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return  new TrivialParticleUpperBound(this);
	} else if (name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "SP" || name == "DEFAULT") {
		return new TagSPParticleUpperBound(this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported particle lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN (default to SP)" << endl;
		exit(1);
		return NULL;
	}
}